

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.cpp
# Opt level: O2

void __thiscall Program::run_program(Program *this,EvalState *state)

{
  int lineNumber;
  Program *pPVar1;
  Statement *pSVar2;
  ErrorException err;
  
  pPVar1 = (Program *)
           ((this->list_of_program)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
  if ((this->list_of_program)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pPVar1 = this;
  }
  for (lineNumber = pPVar1->end_line; lineNumber != this->end_line;
      lineNumber = getNextLineNumber(this,lineNumber)) {
    pSVar2 = getParsedStatement(this,lineNumber);
    (*pSVar2->_vptr_Statement[2])(pSVar2,state);
  }
  return;
}

Assistant:

void Program::run_program(EvalState &state) {
    int num = getFirstLineNumber();
    while (num != end_line) {
        try {
            getParsedStatement(num)->execute(state);
        } catch (ControlClass C) {
            if (C.type == 0) { break; }
            if (C.type == 1) {
                if (list_of_program.count(C.line_number)) {
                    num = C.line_number;
                    continue;
                } else cout << "LINE NUMBER ERROR" << endl;
            }
        }
        catch (ErrorException err) {
            cout << err.getMessage() << endl;
        }
        catch (...) {

        }
        num = getNextLineNumber(num);
    }
}